

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O0

bool DerBase::DecodeSet<Attribute>
               (uchar *pIn,size_t cbIn,size_t *cbUsed,
               vector<Attribute,_std::allocator<Attribute>_> *out)

{
  bool bVar1;
  size_t sStack_38;
  bool ret;
  size_t cbSize;
  size_t cbPrefix;
  vector<Attribute,_std::allocator<Attribute>_> *out_local;
  size_t *cbUsed_local;
  size_t cbIn_local;
  uchar *pIn_local;
  
  cbSize = 0;
  sStack_38 = 0;
  cbPrefix = (size_t)out;
  out_local = (vector<Attribute,_std::allocator<Attribute>_> *)cbUsed;
  cbUsed_local = (size_t *)cbIn;
  cbIn_local = (size_t)pIn;
  bVar1 = DecodeSetOrSequenceOf<Attribute>
                    (ConstructedSet,pIn,cbIn,&cbSize,&stack0xffffffffffffffc8,out);
  if (bVar1) {
    (out_local->super__Vector_base<Attribute,_std::allocator<Attribute>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)(cbSize + sStack_38);
  }
  return bVar1;
}

Assistant:

static bool DecodeSet(const unsigned char* pIn, size_t cbIn, size_t& cbUsed, std::vector<T>& out)
	{
		size_t cbPrefix = 0;
		size_t cbSize = 0;
		bool ret = DecodeSetOrSequenceOf(DerType::ConstructedSet, pIn, cbIn, cbPrefix, cbSize, out);

		if (ret)
			cbUsed = cbPrefix + cbSize;

		return ret;
	}